

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printPixelType(PixelType pt)

{
  ostream *this;
  int in_EDI;
  
  if (in_EDI == 0) {
    std::operator<<((ostream *)&std::cout,"32-bit unsigned integer");
  }
  else if (in_EDI == 1) {
    std::operator<<((ostream *)&std::cout,"16-bit floating-point");
  }
  else if (in_EDI == 2) {
    std::operator<<((ostream *)&std::cout,"32-bit floating-point");
  }
  else {
    this = std::operator<<((ostream *)&std::cout,"type ");
    std::ostream::operator<<(this,in_EDI);
  }
  return;
}

Assistant:

void
printPixelType (PixelType pt)
{
    switch (pt)
    {
        case UINT: cout << "32-bit unsigned integer"; break;

        case HALF: cout << "16-bit floating-point"; break;

        case FLOAT: cout << "32-bit floating-point"; break;

        default: cout << "type " << int (pt); break;
    }
}